

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void httplib::detail::split(char *b,char *e,char d,function<void_(const_char_*,_const_char_*)> *fn)

{
  char *pcVar1;
  char cVar2;
  size_t right;
  size_t left;
  pair<unsigned_long,_unsigned_long> pVar3;
  
  left = 0;
  right = left;
  do {
    pcVar1 = b + right;
    if (e == (char *)0x0) {
      cVar2 = *pcVar1;
      if (cVar2 == '\0') goto LAB_0013904c;
    }
    else {
      if (e <= pcVar1) {
LAB_0013904c:
        if (right != 0) {
          pVar3 = trim(b,e,left,right);
          if (pVar3.first < pVar3.second) {
            std::function<void_(const_char_*,_const_char_*)>::operator()
                      (fn,b + pVar3.first,b + pVar3.second);
            return;
          }
        }
        return;
      }
      cVar2 = *pcVar1;
    }
    if (cVar2 == d) {
      pVar3 = trim(b,e,left,right);
      if (pVar3.first < pVar3.second) {
        std::function<void_(const_char_*,_const_char_*)>::operator()
                  (fn,b + pVar3.first,b + pVar3.second);
      }
      left = right + 1;
      right = left;
    }
    else {
      right = right + 1;
    }
  } while( true );
}

Assistant:

inline void split(const char *b, const char *e, char d,
                  std::function<void(const char *, const char *)> fn) {
  size_t i = 0;
  size_t beg = 0;

  while (e ? (b + i < e) : (b[i] != '\0')) {
    if (b[i] == d) {
      auto r = trim(b, e, beg, i);
      if (r.first < r.second) { fn(&b[r.first], &b[r.second]); }
      beg = i + 1;
    }
    i++;
  }

  if (i) {
    auto r = trim(b, e, beg, i);
    if (r.first < r.second) { fn(&b[r.first], &b[r.second]); }
  }
}